

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

uint32_t helper_sar_cc_aarch64(CPUARMState_conflict *env,uint32_t x,uint32_t i)

{
  byte bVar1;
  uint uVar2;
  
  bVar1 = (byte)i;
  if ((i & 0xff) < 0x20) {
    if ((i & 0xff) == 0) {
      return x;
    }
    uVar2 = (uint)((x >> ((byte)(bVar1 - 1) & 0x1f) & 1) != 0);
  }
  else {
    uVar2 = x >> 0x1f;
    bVar1 = 0x1f;
  }
  env->CF = uVar2;
  return (int)x >> (bVar1 & 0x1f);
}

Assistant:

uint32_t HELPER(sar_cc)(CPUARMState *env, uint32_t x, uint32_t i)
{
    int shift = i & 0xff;
    if (shift >= 32) {
        env->CF = (x >> 31) & 1;
        return (int32_t)x >> 31;
    } else if (shift != 0) {
        env->CF = (x >> (shift - 1)) & 1;
        return (int32_t)x >> shift;
    }
    return x;
}